

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O2

unsigned_long
chaiscript::boxed_cast<unsigned_long>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  unsigned_long uVar5;
  undefined8 *puVar6;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  _Rb_tree_color local_28;
  undefined4 uStack_24;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_38 = (undefined1  [8])&unsigned_long::typeinfo;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&unsigned_long::typeinfo;
    local_28 = 0x10;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_38);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<unsigned_long>
                          ((t_conversions->m_conversions)._M_data), bVar4)) {
      bVar4 = Type_Conversions::convertable_type<unsigned_long>
                        ((t_conversions->m_conversions)._M_data);
      if (bVar4) {
        Type_Conversions::boxed_type_conversion<unsigned_long>
                  ((Type_Conversions *)local_38,
                   (Conversion_Saves *)(t_conversions->m_conversions)._M_data,
                   (Boxed_Value *)(t_conversions->m_saves)._M_data);
        uVar5 = detail::Cast_Helper_Inner<unsigned_long>::cast
                          ((Boxed_Value *)local_38,t_conversions);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
        return uVar5;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
      peVar1 = (bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_28 = (peVar1->m_type_info).m_flags;
      uStack_24 = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
      peVar2 = (element_type *)(peVar1->m_type_info).m_type_info;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (peVar1->m_type_info).m_bare_type_info;
      *puVar6 = &PTR__bad_cast_004535e0;
      local_38._0_4_ = SUB84(peVar2,0);
      local_38._4_4_ = (undefined4)((ulong)peVar2 >> 0x20);
      _Stack_30._M_pi._0_4_ = SUB84(p_Var3,0);
      _Stack_30._M_pi._4_4_ = (undefined4)((ulong)p_Var3 >> 0x20);
      *(undefined4 *)(puVar6 + 1) = local_38._0_4_;
      *(undefined4 *)((long)puVar6 + 0xc) = local_38._4_4_;
      *(undefined4 *)(puVar6 + 2) = _Stack_30._M_pi._0_4_;
      *(undefined4 *)((long)puVar6 + 0x14) = _Stack_30._M_pi._4_4_;
      puVar6[3] = _local_28;
      puVar6[4] = &unsigned_long::typeinfo;
      puVar6[5] = 0x19;
      puVar6[6] = "Cannot perform boxed_cast";
      local_38 = (undefined1  [8])peVar2;
      _Stack_30._M_pi = p_Var3;
      __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  uVar5 = detail::Cast_Helper_Inner<unsigned_long>::cast(bv,t_conversions);
  return uVar5;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }